

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  BYTE *pBVar12;
  BYTE *ip [4];
  U64 bits [4];
  BYTE *local_b8 [4];
  BYTE *local_98 [4];
  U64 local_78 [4];
  BYTE *local_58 [5];
  
  pvVar3 = args->dt;
  pBVar4 = args->ilimit;
  local_78[2] = args->bits[2];
  local_78[3] = args->bits[3];
  local_78[0] = args->bits[0];
  local_78[1] = args->bits[1];
  local_98[0] = args->ip[0];
  local_98[1] = args->ip[1];
  local_98[2] = args->ip[2];
  local_98[3] = args->ip[3];
  local_b8[0] = args->op[0];
  local_b8[1] = args->op[1];
  local_b8[2] = args->op[2];
  local_b8[3] = args->op[3];
  local_58[0] = args->op[1];
  local_58[1] = args->op[2];
  local_58[2] = args->op[3];
  local_58[3] = args->oend;
  lVar11 = 0;
  do {
    do {
      if (local_58[lVar11] < local_b8[lVar11]) {
        __assert_fail("op[stream] <= oend[stream]",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9210,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      if (local_b8[lVar11 + 4] < pBVar4) {
        __assert_fail("ip[stream] >= ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9211,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lVar11 = 0;
    uVar10 = (ulong)((long)local_98[0] - (long)pBVar4) / 7;
    do {
      uVar9 = (ulong)((long)local_58[lVar11] - (long)local_b8[lVar11]) / 10;
      if (uVar10 < uVar9) {
        uVar9 = uVar10;
      }
      lVar11 = lVar11 + 1;
      uVar10 = uVar9;
    } while (lVar11 != 4);
    pBVar12 = local_b8[3] + uVar9 * 5;
    if (uVar9 < 2) {
      iVar8 = 2;
      bVar6 = false;
    }
    else {
      lVar11 = 1;
      do {
        bVar6 = local_b8[lVar11 + 4] >= local_b8[lVar11 + 3];
        if (local_b8[lVar11 + 4] < local_b8[lVar11 + 3]) {
          iVar8 = 0xd;
          goto LAB_001d964e;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      iVar8 = 0;
    }
LAB_001d964e:
    if (bVar6) {
      lVar11 = 1;
      do {
        if (local_b8[lVar11 + 4] < local_b8[lVar11 + 3]) {
          __assert_fail("ip[stream] >= ip[stream - 1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x9240,
                        "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                       );
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      iVar8 = 0;
      do {
        do {
          lVar11 = 0;
          do {
            uVar10 = local_78[lVar11];
            uVar9 = uVar10 >> 0x35;
            bVar1 = *(byte *)((long)pvVar3 + uVar9 * 4 + 2);
            bVar2 = *(byte *)((long)pvVar3 + uVar9 * 4 + 3);
            pBVar5 = local_b8[lVar11];
            *(undefined2 *)pBVar5 = *(undefined2 *)((long)pvVar3 + uVar9 * 4);
            local_78[lVar11] = uVar10 << ((ulong)bVar1 & 0x3f);
            local_b8[lVar11] = pBVar5 + bVar2;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          iVar8 = iVar8 + 1;
        } while (iVar8 != 5);
        uVar10 = local_78[3] >> 0x35;
        bVar1 = *(byte *)((long)pvVar3 + uVar10 * 4 + 2);
        bVar2 = *(byte *)((long)pvVar3 + uVar10 * 4 + 3);
        *(undefined2 *)local_b8[3] = *(undefined2 *)((long)pvVar3 + uVar10 * 4);
        local_78[3] = local_78[3] << ((ulong)bVar1 & 0x3f);
        local_b8[3] = local_b8[3] + bVar2;
        lVar11 = 0;
        do {
          uVar10 = local_78[3] >> 0x35;
          bVar1 = *(byte *)((long)pvVar3 + uVar10 * 4 + 2);
          bVar2 = *(byte *)((long)pvVar3 + uVar10 * 4 + 3);
          *(undefined2 *)local_b8[3] = *(undefined2 *)((long)pvVar3 + uVar10 * 4);
          local_78[3] = local_78[3] << ((ulong)bVar1 & 0x3f);
          local_b8[3] = local_b8[3] + bVar2;
          uVar7 = 0;
          for (uVar10 = local_78[lVar11]; (uVar10 & 1) == 0;
              uVar10 = uVar10 >> 1 | 0x8000000000000000) {
            uVar7 = uVar7 + 1;
          }
          pBVar5 = local_b8[lVar11 + 4];
          local_b8[lVar11 + 4] = pBVar5 + -(ulong)(uVar7 >> 3);
          local_78[lVar11] = (*(ulong *)(pBVar5 + -(ulong)(uVar7 >> 3)) | 1) << ((byte)uVar7 & 7);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        iVar8 = 0;
      } while (local_b8[3] < pBVar12);
    }
    lVar11 = 0;
    if (iVar8 != 0) {
      args->bits[2] = local_78[2];
      args->bits[3] = local_78[3];
      args->bits[0] = local_78[0];
      args->bits[1] = local_78[1];
      args->ip[2] = local_98[2];
      args->ip[3] = local_98[3];
      args->ip[0] = local_98[0];
      args->ip[1] = local_98[1];
      args->op[2] = local_b8[2];
      args->op[3] = local_b8[3];
      args->op[0] = local_b8[0];
      args->op[1] = local_b8[1];
      return;
    }
  } while( true );
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    BYTE* oend[4];
    HUF_DEltX2 const* const dtable = (HUF_DEltX2 const*)args->dt;
    BYTE const* const ilimit = args->ilimit;

    /* Copy the arguments to local registers. */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    oend[0] = op[1];
    oend[1] = op[2];
    oend[2] = op[3];
    oend[3] = args->oend;

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;
        int symbol;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= oend[stream]);
            assert(ip[stream] >= ilimit);
        }
#endif
        /* Compute olimit */
        {
            /* Each loop does 5 table lookups for each of the 4 streams.
             * Each table lookup consumes up to 11 bits of input, and produces
             * up to 2 bytes of output.
             */
            /* We can consume up to 7 bytes of input per iteration per stream.
             * We also know that each input pointer is >= ip[0]. So we can run
             * iters loops before running out of input.
             */
            size_t iters = (size_t)(ip[0] - ilimit) / 7;
            /* Each iteration can produce up to 10 bytes of output per stream.
             * Each output stream my advance at different rates. So take the
             * minimum number of safe iterations among all the output streams.
             */
            for (stream = 0; stream < 4; ++stream) {
                size_t const oiters = (size_t)(oend[stream] - op[stream]) / 10;
                iters = MIN(iters, oiters);
            }

            /* Each iteration produces at least 5 output symbols. So until
             * op[3] crosses olimit, we know we haven't executed iters
             * iterations yet. This saves us maintaining an iters counter,
             * at the expense of computing the remaining # of iterations
             * more frequently.
             */
            olimit = op[3] + (iters * 5);

            /* Exit the fast decoding loop if we are too close to the end. */
            if (op[3] + 10 > olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

        do {
            /* Do 5 table lookups for each of the first 3 streams */
            for (symbol = 0; symbol < 5; ++symbol) {
                for (stream = 0; stream < 3; ++stream) {
                    int const index = (int)(bits[stream] >> 53);
                    HUF_DEltX2 const entry = dtable[index];
                    MEM_write16(op[stream], entry.sequence);
                    bits[stream] <<= (entry.nbBits);
                    op[stream] += (entry.length);
                }
            }
            /* Do 1 table lookup from the final stream */
            {
                int const index = (int)(bits[3] >> 53);
                HUF_DEltX2 const entry = dtable[index];
                MEM_write16(op[3], entry.sequence);
                bits[3] <<= (entry.nbBits);
                op[3] += (entry.length);
            }
            /* Do 4 table lookups from the final stream & reload bitstreams */
            for (stream = 0; stream < 4; ++stream) {
                /* Do a table lookup from the final stream.
                 * This is interleaved with the reloading to reduce register
                 * pressure. This shouldn't be necessary, but compilers can
                 * struggle with codegen with high register pressure.
                 */
                {
                    int const index = (int)(bits[3] >> 53);
                    HUF_DEltX2 const entry = dtable[index];
                    MEM_write16(op[3], entry.sequence);
                    bits[3] <<= (entry.nbBits);
                    op[3] += (entry.length);
                }
                /* Reload the bistreams. The final bitstream must be reloaded
                 * after the 5th symbol was decoded.
                 */
                {
                    int const ctz = ZSTD_countTrailingZeros64(bits[stream]);
                    int const nbBits = ctz & 7;
                    int const nbBytes = ctz >> 3;
                    ip[stream] -= nbBytes;
                    bits[stream] = MEM_read64(ip[stream]) | 1;
                    bits[stream] <<= nbBits;
                }
            }
        } while (op[3] < olimit);
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}